

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

void glad_debug_impl_glVertexAttrib2f(GLuint arg0,GLfloat arg1,GLfloat arg2)

{
  (*_pre_call_callback)("glVertexAttrib2f",glad_debug_glVertexAttrib2f,3,arg0);
  (*glad_glVertexAttrib2f)(arg0,arg1,arg2);
  (*_post_call_callback)
            ("glVertexAttrib2f",glad_debug_glVertexAttrib2f,3,(double)arg1,(double)arg2,arg0,
             _post_call_callback);
  return;
}

Assistant:

void APIENTRY glad_debug_impl_glVertexAttrib2f(GLuint arg0, GLfloat arg1, GLfloat arg2) {    
    _pre_call_callback("glVertexAttrib2f", (void*)glVertexAttrib2f, 3, arg0, arg1, arg2);
     glad_glVertexAttrib2f(arg0, arg1, arg2);
    _post_call_callback("glVertexAttrib2f", (void*)glVertexAttrib2f, 3, arg0, arg1, arg2);
    
}